

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O1

int fetch_all_frequencies_db(feed_db_t *db,frequency_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  frequency_t *pfVar4;
  uchar *puVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  byte bVar10;
  sqlite3_stmt *stmt;
  frequency_t record;
  char qr [83];
  sqlite3_stmt *local_f0;
  uint local_e8;
  frequency_t local_e4;
  char local_88 [80];
  undefined2 local_38;
  undefined1 local_36;
  
  bVar10 = 0;
  uVar2 = count_rows_db(db,"frequencies");
  if (0 < (int)uVar2) {
    pcVar8 = "SELECT trip_id, start_time, end_time,headway_secs, exact_times FROM `frequencies`;";
    pcVar9 = local_88;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pcVar9 = *(undefined8 *)pcVar8;
      pcVar8 = pcVar8 + ((ulong)bVar10 * -2 + 1) * 8;
      pcVar9 = pcVar9 + (ulong)bVar10 * -0x10 + 8;
    }
    local_36 = 0;
    local_38 = 0x3b60;
    sqlite3_prepare_v2(db->conn,local_88,-1,&local_f0,(char **)0x0);
    pfVar4 = (frequency_t *)malloc((ulong)uVar2 * 0x5c);
    *records = pfVar4;
    uVar1 = 0xffffffff;
    if (pfVar4 != (frequency_t *)0x0) {
      lVar6 = 0;
      local_e8 = uVar2;
      do {
        iVar3 = sqlite3_step(local_f0);
        db->rc = iVar3;
        uVar1 = local_e8;
        if (iVar3 != 100) break;
        init_frequency(&local_e4);
        puVar5 = sqlite3_column_text(local_f0,0);
        strcpy(local_e4.trip_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_f0,1);
        strcpy(local_e4.start_time,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_f0,2);
        strcpy(local_e4.end_time,(char *)puVar5);
        local_e4.headway_secs = sqlite3_column_int(local_f0,3);
        local_e4.exact_times = sqlite3_column_int(local_f0,4);
        pfVar4 = &local_e4;
        pcVar8 = (*records)->trip_id + lVar6;
        for (lVar7 = 0x17; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(undefined4 *)pcVar8 = *(undefined4 *)pfVar4->trip_id;
          pfVar4 = (frequency_t *)((long)pfVar4 + (ulong)bVar10 * -8 + 4);
          pcVar8 = pcVar8 + ((ulong)bVar10 * -2 + 1) * 4;
        }
        lVar6 = lVar6 + 0x5c;
        uVar1 = local_e8;
      } while ((ulong)uVar2 * 0x5c - lVar6 != 0);
    }
    uVar2 = uVar1;
    sqlite3_finalize(local_f0);
  }
  return uVar2;
}

Assistant:

int fetch_all_frequencies_db(feed_db_t *db, frequency_t **records) {

    frequency_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "frequencies");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "trip_id, start_time, end_time,"
                    "headway_secs, exact_times "
                "FROM `frequencies`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_frequency(&record);

        strcpy(record.trip_id, sqlite3_column_text(stmt, 0));
        strcpy(record.start_time, sqlite3_column_text(stmt, 1));
        strcpy(record.end_time, sqlite3_column_text(stmt, 2));
        record.headway_secs = sqlite3_column_int(stmt, 3);
        record.exact_times = (time_exactness_t)sqlite3_column_int(stmt, 4);

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}